

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::string_t,duckdb::string_t,duckdb::Equals,false>
                (string_t *ldata,string_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  bool bVar5;
  idx_t iVar6;
  SelectionVector *pSVar7;
  idx_t iVar8;
  idx_t iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t local_50;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar10 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        lVar10 = 0;
        uVar14 = 0;
        do {
          uVar11 = uVar14;
          if (psVar1 != (sel_t *)0x0) {
            uVar11 = (ulong)psVar1[uVar14];
          }
          uVar13 = uVar14;
          if (psVar2 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar2[uVar14];
          }
          uVar12 = uVar14;
          if (psVar3 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar3[uVar14];
          }
          puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((((puVar4 != (unsigned_long *)0x0) &&
               ((puVar4[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0)) ||
              ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
               puVar4 != (unsigned_long *)0x0 && ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0)
               ))) || (bVar5 = string_t::operator==(ldata + uVar13,rdata + uVar12), !bVar5)) {
            false_sel->sel_vector[lVar10] = (sel_t)uVar11;
            lVar10 = lVar10 + 1;
          }
          uVar14 = uVar14 + 1;
        } while (count != uVar14);
      }
      return count - lVar10;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      local_50 = 0;
      uVar14 = 0;
      do {
        uVar11 = uVar14;
        if (psVar1 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar1[uVar14];
        }
        uVar13 = uVar14;
        if (psVar2 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar2[uVar14];
        }
        uVar12 = uVar14;
        if (psVar3 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar3[uVar14];
        }
        puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((((puVar4 == (unsigned_long *)0x0) ||
             ((puVar4[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)) &&
            ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))
            ) && (bVar5 = string_t::operator==(ldata + uVar13,rdata + uVar12), bVar5)) {
          true_sel->sel_vector[local_50] = (sel_t)uVar11;
          local_50 = local_50 + 1;
        }
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
      return local_50;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_50 = 0;
    uVar14 = 0;
    iVar8 = 0;
    do {
      uVar11 = uVar14;
      if (psVar1 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar1[uVar14];
      }
      uVar13 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar2[uVar14];
      }
      uVar12 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar3[uVar14];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0))
          && ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
             )) && (bVar5 = string_t::operator==(ldata + uVar13,rdata + uVar12), bVar5)) {
        iVar6 = local_50;
        pSVar7 = true_sel;
        iVar9 = iVar8;
        local_50 = local_50 + 1;
      }
      else {
        iVar9 = iVar8 + 1;
        iVar6 = iVar8;
        pSVar7 = false_sel;
      }
      pSVar7->sel_vector[iVar6] = (sel_t)uVar11;
      uVar14 = uVar14 + 1;
      iVar8 = iVar9;
    } while (count != uVar14);
    return local_50;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}